

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLSLangUtils.cpp
# Opt level: O1

IncludeResult * __thiscall
Diligent::GLSLangUtils::anon_unknown_3::IncluderImpl::includeSystem
          (IncluderImpl *this,char *headerName,char *param_2,size_t param_3)

{
  IncludeResult *pIVar1;
  char *pcVar2;
  size_t sVar3;
  RefCntAutoPtr<Diligent::DataBlobImpl> pFileData;
  RefCntAutoPtr<Diligent::IFileStream> pSourceStream;
  string msg;
  IncludeResult *pNewInclude;
  allocator<char> local_61;
  IObject local_60;
  RefCntAutoPtr<Diligent::IFileStream> local_58;
  IMemoryAllocator *local_50;
  string local_48;
  IncludeResult *local_28;
  
  local_50 = (IMemoryAllocator *)headerName;
  if (this->m_pInputStreamFactory == (IShaderSourceInputStreamFactory *)0x0) {
    FormatString<char[89]>
              (&local_48,
               (char (*) [89])
               "The shader source contains #include directives, but no input stream factory was provided"
              );
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"includeSystem",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/GLSLangUtils.cpp"
               ,0x136);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  local_48._M_string_length = (size_type)&local_58;
  local_58.m_pObject = (IFileStream *)0x0;
  local_48._M_dataplus._M_p = (pointer)0x0;
  (*(this->m_pInputStreamFactory->super_IObject)._vptr_IObject[4])();
  RefCntAutoPtr<Diligent::IFileStream>::DoublePtrHelper<Diligent::IFileStream>::~DoublePtrHelper
            ((DoublePtrHelper<Diligent::IFileStream> *)&local_48);
  if (local_58.m_pObject == (IFileStream *)0x0) {
    pIVar1 = (IncludeResult *)0x0;
    LogError<false,char[37],char_const*,char[30]>
              (false,"includeSystem",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/GLSLangUtils.cpp"
               ,0x13b,(char (*) [37])"Failed to open shader include file \'",(char **)&local_50,
               (char (*) [30])"\'. Check that the file exists");
  }
  else {
    DataBlobImpl::Create((DataBlobImpl *)&local_60,0,(void *)0x0);
    (*((local_58.m_pObject)->super_IObject)._vptr_IObject[5])
              (local_58.m_pObject,local_60._vptr_IObject);
    pIVar1 = (IncludeResult *)operator_new(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,(char *)local_50,&local_61);
    pcVar2 = (char *)DataBlobImpl::GetConstDataPtr((DataBlobImpl *)local_60._vptr_IObject,0);
    sVar3 = DataBlobImpl::GetSize((DataBlobImpl *)local_60._vptr_IObject);
    (pIVar1->headerName)._M_dataplus._M_p = (pointer)&(pIVar1->headerName).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)pIVar1,local_48._M_dataplus._M_p,
               local_48._M_dataplus._M_p + (long)(IFileStream **)local_48._M_string_length);
    pIVar1->headerData = pcVar2;
    pIVar1->headerLength = sVar3;
    pIVar1->userData = (void *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    local_28 = pIVar1;
    std::
    _Hashtable<std::unique_ptr<glslang::TShader::Includer::IncludeResult,std::default_delete<glslang::TShader::Includer::IncludeResult>>,std::unique_ptr<glslang::TShader::Includer::IncludeResult,std::default_delete<glslang::TShader::Includer::IncludeResult>>,std::allocator<std::unique_ptr<glslang::TShader::Includer::IncludeResult,std::default_delete<glslang::TShader::Includer::IncludeResult>>>,std::__detail::_Identity,std::equal_to<std::unique_ptr<glslang::TShader::Includer::IncludeResult,std::default_delete<glslang::TShader::Includer::IncludeResult>>>,std::hash<std::unique_ptr<glslang::TShader::Includer::IncludeResult,std::default_delete<glslang::TShader::Includer::IncludeResult>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::_M_emplace<glslang::TShader::Includer::IncludeResult*&>
              ((_Hashtable<std::unique_ptr<glslang::TShader::Includer::IncludeResult,std::default_delete<glslang::TShader::Includer::IncludeResult>>,std::unique_ptr<glslang::TShader::Includer::IncludeResult,std::default_delete<glslang::TShader::Includer::IncludeResult>>,std::allocator<std::unique_ptr<glslang::TShader::Includer::IncludeResult,std::default_delete<glslang::TShader::Includer::IncludeResult>>>,std::__detail::_Identity,std::equal_to<std::unique_ptr<glslang::TShader::Includer::IncludeResult,std::default_delete<glslang::TShader::Includer::IncludeResult>>>,std::hash<std::unique_ptr<glslang::TShader::Includer::IncludeResult,std::default_delete<glslang::TShader::Includer::IncludeResult>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&this->m_IncludeRes);
    std::
    _Hashtable<glslang::TShader::Includer::IncludeResult*,std::pair<glslang::TShader::Includer::IncludeResult*const,Diligent::RefCntAutoPtr<Diligent::IDataBlob>>,std::allocator<std::pair<glslang::TShader::Includer::IncludeResult*const,Diligent::RefCntAutoPtr<Diligent::IDataBlob>>>,std::__detail::_Select1st,std::equal_to<glslang::TShader::Includer::IncludeResult*>,std::hash<glslang::TShader::Includer::IncludeResult*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<glslang::TShader::Includer::IncludeResult*&,Diligent::RefCntAutoPtr<Diligent::DataBlobImpl>>
              ((_Hashtable<glslang::TShader::Includer::IncludeResult*,std::pair<glslang::TShader::Includer::IncludeResult*const,Diligent::RefCntAutoPtr<Diligent::IDataBlob>>,std::allocator<std::pair<glslang::TShader::Includer::IncludeResult*const,Diligent::RefCntAutoPtr<Diligent::IDataBlob>>>,std::__detail::_Select1st,std::equal_to<glslang::TShader::Includer::IncludeResult*>,std::hash<glslang::TShader::Includer::IncludeResult*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->m_DataBlobs,&local_28,&local_60);
    pIVar1 = local_28;
    RefCntAutoPtr<Diligent::DataBlobImpl>::Release
              ((RefCntAutoPtr<Diligent::DataBlobImpl> *)&local_60);
  }
  if (local_58.m_pObject != (IFileStream *)0x0) {
    (*((local_58.m_pObject)->super_IObject)._vptr_IObject[2])();
  }
  return pIVar1;
}

Assistant:

virtual IncludeResult* includeSystem(const char* headerName,
                                         const char* /*includerName*/,
                                         size_t /*inclusionDepth*/)
    {
        DEV_CHECK_ERR(m_pInputStreamFactory != nullptr, "The shader source contains #include directives, but no input stream factory was provided");
        RefCntAutoPtr<IFileStream> pSourceStream;
        m_pInputStreamFactory->CreateInputStream(headerName, &pSourceStream);
        if (pSourceStream == nullptr)
        {
            LOG_ERROR("Failed to open shader include file '", headerName, "'. Check that the file exists");
            return nullptr;
        }

        auto pFileData = DataBlobImpl::Create();
        pSourceStream->ReadBlob(pFileData);
        auto* pNewInclude =
            new IncludeResult{
                headerName,
                pFileData->GetConstDataPtr<char>(),
                pFileData->GetSize(),
                nullptr};

        m_IncludeRes.emplace(pNewInclude);
        m_DataBlobs.emplace(pNewInclude, std::move(pFileData));
        return pNewInclude;
    }